

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RenameMemoryToRegister
               (ExpressionContext *ctx,VmModule *module,VmBlock *block,
               SmallArray<VmValue_*,_32U> *stack,VariableData *variable,
               ArrayView<VmInstruction_*> phiNodes)

{
  ulong uVar1;
  uint uVar2;
  FunctionData *pFVar3;
  TypeBase *type;
  VmBlock *pVVar4;
  char *pcVar5;
  bool bVar6;
  VmValueType VVar7;
  ulong uVar8;
  VmValue **ppVVar9;
  VmConstant *pVVar10;
  VariableData *variable_00;
  VmValue *pVVar11;
  VmInstruction *pVVar12;
  ulong uVar13;
  TypeBase *structType;
  ulong uVar14;
  uint uVar15;
  VmInstruction *pVVar16;
  VmInstruction *pVVar17;
  long lVar18;
  uint uVar19;
  undefined8 in_R9;
  int iVar20;
  bool bVar21;
  VmType VVar22;
  VmType type_00;
  VmValue *in_stack_ffffffffffffff88;
  
  uVar19 = (uint)in_R9;
  uVar2 = stack->count;
  pVVar12 = block->firstInstruction;
  if (pVVar12 == (VmInstruction *)0x0) {
    bVar21 = false;
  }
  else {
    uVar14 = (ulong)phiNodes.count;
    bVar21 = false;
    do {
      bVar6 = IsMemoryLoadOfVariable(pVVar12,variable);
      if (bVar6) {
        (pVVar12->super_VmValue).canBeRemoved = false;
        if ((block->prevSibling == (VmBlock *)0x0) && (stack->count == 0)) {
          if (stack->max == 0) {
            SmallArray<VmValue_*,_32U>::grow(stack,0);
          }
          if (stack->data == (VmValue **)0x0) goto LAB_001ba4ac;
          uVar19 = stack->count;
          stack->count = uVar19 + 1;
          stack->data[uVar19] = &pVVar12->super_VmValue;
        }
        else {
          if (stack->count == 0) goto LAB_001ba46e;
          anon_unknown.dwarf_13465d::ReplaceValueUsersWith
                    (module,&pVVar12->super_VmValue,stack->data[stack->count - 1],(uint *)0x0);
        }
        (pVVar12->super_VmValue).canBeRemoved = true;
      }
      bVar6 = IsMemoryStoreToVariable(pVVar12,variable);
      if (bVar6) {
        if ((pVVar12->arguments).count < 3) {
LAB_001ba44f:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        pVVar17 = (VmInstruction *)(pVVar12->arguments).data[2];
        if ((pVVar17 == (VmInstruction *)0x0) ||
           (pVVar16 = pVVar17, (pVVar17->super_VmValue).typeID != 2)) {
          pVVar16 = (VmInstruction *)0x0;
        }
        if (pVVar16 == (VmInstruction *)0x0) {
          if ((pVVar17 == (VmInstruction *)0x0) || ((pVVar17->super_VmValue).typeID != 1)) {
            pVVar17 = (VmInstruction *)0x0;
          }
          pVVar16 = pVVar17;
          if (pVVar17 == (VmInstruction *)0x0) {
            __assert_fail("!\"unknown argument type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1718,
                          "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                         );
          }
        }
        else {
          pcVar5 = (variable->name->name).end;
          (pVVar16->super_VmValue).comment.begin = (variable->name->name).begin;
          (pVVar16->super_VmValue).comment.end = pcVar5;
          if ((pVVar16->super_VmValue).typeID != 2) {
            pVVar16 = (VmInstruction *)0x0;
          }
        }
        if (stack->count == stack->max) {
          SmallArray<VmValue_*,_32U>::grow(stack,stack->count);
        }
        ppVVar9 = stack->data;
        bVar21 = true;
LAB_001b9f84:
        if (ppVVar9 == (VmValue **)0x0) goto LAB_001ba4ac;
        uVar19 = stack->count;
        stack->count = uVar19 + 1;
        ppVVar9[uVar19] = &pVVar16->super_VmValue;
      }
      else if (pVVar12->cmd == VM_INST_PHI && phiNodes.count != 0) {
        bVar6 = uVar14 != 0;
        if (*phiNodes.data != pVVar12) {
          uVar8 = 0;
          do {
            if (uVar14 - 1 == uVar8) goto LAB_001b9fa1;
            uVar13 = uVar8 + 1;
            lVar18 = uVar8 + 1;
            uVar8 = uVar13;
          } while (phiNodes.data[lVar18] != pVVar12);
          bVar6 = uVar13 < uVar14;
        }
        if (bVar6) {
          if (stack->count == stack->max) {
            SmallArray<VmValue_*,_32U>::grow(stack,stack->count);
          }
          ppVVar9 = stack->data;
          pVVar16 = pVVar12;
          goto LAB_001b9f84;
        }
      }
LAB_001b9fa1:
      uVar19 = (uint)in_R9;
      pVVar12 = pVVar12->nextSibling;
    } while (pVVar12 != (VmInstruction *)0x0);
  }
  if ((block->prevSibling == (VmBlock *)0x0) && (stack->count == 0)) {
    module->currentBlock = block;
    pVVar12 = block->insertPoint;
    while (((pVVar12 != (VmInstruction *)0x0 &&
            (uVar15 = pVVar12->cmd - VM_INST_JUMP, uVar15 < 0x31)) &&
           ((0x1100000000037U >> ((ulong)uVar15 & 0x3f) & 1) != 0))) {
      pVVar12 = pVVar12->prevSibling;
      block->insertPoint = pVVar12;
    }
    pFVar3 = block->parent->function;
    for (structType = (TypeBase *)(pFVar3->argumentVariables).head; structType != (TypeBase *)0x0;
        structType = (TypeBase *)(structType->name).begin) {
      if (*(VariableData **)&structType->typeID == variable) {
        if (structType != (TypeBase *)0x0) goto LAB_001ba171;
        break;
      }
    }
    if (pFVar3->contextArgument == variable) {
LAB_001ba171:
      type = variable->type;
      variable_00 = (VariableData *)ExpressionContext::GetReferenceType(ctx,type);
      pVVar11 = anon_unknown.dwarf_13465d::CreateVariableAddress
                          (module,(SynBase *)variable,variable_00,structType);
      pVVar12 = (VmInstruction *)
                anon_unknown.dwarf_13465d::CreateLoad(ctx,module,(SynBase *)0x0,type,pVVar11,uVar19)
      ;
    }
    else {
      VVar22 = GetVmType(ctx,variable->type);
      VVar7 = VVar22.type;
      if (VVar22._0_8_ >> 0x20 == 4 && VVar7 == VM_TYPE_INT) {
        pVVar10 = CreateConstantInt(module->allocator,(SynBase *)0x0,0);
      }
      else if (VVar22.size == 8 && VVar7 == VM_TYPE_DOUBLE) {
        pVVar10 = CreateConstantDouble(module->allocator,(SynBase *)0x0,0.0);
      }
      else {
        if ((VVar7 != VM_TYPE_POINTER) && (VVar7 != VM_TYPE_LONG || VVar22.size != 8)) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x173e,
                        "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                       );
        }
        pVVar10 = CreateConstantLong(module->allocator,(SynBase *)0x0,0);
      }
      type_00.structType = (TypeBase *)0x7;
      type_00._0_8_ = (pVVar10->super_VmValue).type.structType;
      pVVar12 = anon_unknown.dwarf_13465d::CreateInstruction
                          ((anon_unknown_dwarf_13465d *)module,(VmModule *)0x0,
                           *(SynBase **)&(pVVar10->super_VmValue).type,type_00,
                           (VmInstructionType)pVVar10,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                           (VmValue *)0x0,in_stack_ffffffffffffff88);
    }
    pcVar5 = (variable->name->name).end;
    (pVVar12->super_VmValue).comment.begin = (variable->name->name).begin;
    (pVVar12->super_VmValue).comment.end = pcVar5;
    if ((pVVar12 == (VmInstruction *)0x0) || ((pVVar12->super_VmValue).typeID != 2)) {
      pVVar12 = (VmInstruction *)0x0;
    }
    if (stack->count == stack->max) {
      SmallArray<VmValue_*,_32U>::grow(stack,stack->count);
    }
    if (stack->data == (VmValue **)0x0) {
LAB_001ba4ac:
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<VmValue *, 32>::push_back(const T &) [T = VmValue *, N = 32]");
    }
    uVar19 = stack->count;
    stack->count = uVar19 + 1;
    stack->data[uVar19] = &pVVar12->super_VmValue;
  }
  else {
    if (!bVar21) goto LAB_001ba274;
    module->currentBlock = block;
    block->insertPoint = block->lastInstruction->prevSibling;
    if (stack->count == 0) {
LAB_001ba46e:
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,"T &SmallArray<VmValue *, 32>::back() [T = VmValue *, N = 32]");
    }
    pVVar11 = stack->data[stack->count - 1];
    if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 1)) {
      pVVar11 = (VmValue *)0x0;
    }
    if (pVVar11 != (VmValue *)0x0) {
      VVar22.structType = (TypeBase *)0x7;
      VVar22._0_8_ = (pVVar11->type).structType;
      pVVar12 = anon_unknown.dwarf_13465d::CreateInstruction
                          ((anon_unknown_dwarf_13465d *)module,(VmModule *)pVVar11->source,
                           *(SynBase **)&pVVar11->type,VVar22,(VmInstructionType)pVVar11,
                           (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                           in_stack_ffffffffffffff88);
      pcVar5 = (variable->name->name).end;
      (pVVar12->super_VmValue).comment.begin = (variable->name->name).begin;
      (pVVar12->super_VmValue).comment.end = pcVar5;
      if (stack->count == 0) goto LAB_001ba46e;
      stack->data[stack->count - 1] = &pVVar12->super_VmValue;
    }
    block->insertPoint = block->lastInstruction;
  }
  module->currentBlock = (VmBlock *)0x0;
LAB_001ba274:
  if ((block->successors).count != 0) {
    uVar8 = (ulong)phiNodes.count;
    uVar14 = 0;
    do {
      pVVar4 = (block->successors).data[uVar14];
      uVar19 = (pVVar4->predecessors).count;
      if (uVar19 == 0) {
        bVar21 = true;
        uVar19 = 0xfffffffe;
      }
      else {
        lVar18 = 0;
        do {
          iVar20 = (int)lVar18;
          if ((pVVar4->predecessors).data[lVar18] != block) {
            iVar20 = -1;
          }
          lVar18 = lVar18 + 1;
          bVar21 = iVar20 == -1;
        } while (((uint)lVar18 < uVar19) && (iVar20 == -1));
        uVar19 = iVar20 * 2;
      }
      if (bVar21) {
        __assert_fail("j != ~0u",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1768,
                      "void RenameMemoryToRegister(ExpressionContext &, VmModule *, VmBlock *, SmallArray<VmValue *, 32> &, VariableData *, ArrayView<VmInstruction *>)"
                     );
      }
      pVVar12 = pVVar4->firstInstruction;
      if (pVVar12 != (VmInstruction *)0x0) {
        do {
          if (pVVar12->cmd != VM_INST_PHI) break;
          if (uVar8 != 0) {
            bVar21 = uVar8 != 0;
            if (*phiNodes.data != pVVar12) {
              uVar13 = 0;
              do {
                if (uVar8 - 1 == uVar13) goto LAB_001ba39c;
                uVar1 = uVar13 + 1;
                lVar18 = uVar13 + 1;
                uVar13 = uVar1;
              } while (phiNodes.data[lVar18] != pVVar12);
              bVar21 = uVar1 < uVar8;
            }
            if (bVar21) {
              if (stack->count == 0) goto LAB_001ba46e;
              if ((pVVar12->arguments).count <= uVar19) goto LAB_001ba44f;
              uVar15 = stack->count - 1;
              (pVVar12->arguments).data[uVar19] = stack->data[uVar15];
              VmValue::AddUse(stack->data[uVar15],&pVVar12->super_VmValue);
            }
          }
LAB_001ba39c:
          pVVar12 = pVVar12->nextSibling;
        } while (pVVar12 != (VmInstruction *)0x0);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (block->successors).count);
  }
  if ((block->dominanceChildren).count != 0) {
    uVar14 = 0;
    do {
      RenameMemoryToRegister
                (ctx,module,(block->dominanceChildren).data[uVar14],stack,variable,phiNodes);
      uVar14 = uVar14 + 1;
    } while (uVar14 < (block->dominanceChildren).count);
  }
  if (uVar2 <= stack->count) {
    stack->count = uVar2;
    return;
  }
  __assert_fail("newSize <= count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x1a8,"void SmallArray<VmValue *, 32>::shrink(unsigned int) [T = VmValue *, N = 32]"
               );
}

Assistant:

void RenameMemoryToRegister(ExpressionContext &ctx, VmModule *module, VmBlock *block, SmallArray<VmValue*, 32> &stack, VariableData *variable, ArrayView<VmInstruction*> phiNodes)
{
	unsigned oldSize = stack.size();

	bool hadUpdate = false;

	for(VmInstruction *instruction = block->firstInstruction; instruction; instruction = instruction->nextSibling)
	{
		if(IsMemoryLoadOfVariable(instruction, variable))
		{
			// Do not reorder instruction stream, perform a separate dead instruction elimination pass later
			instruction->canBeRemoved = false;

			if(!block->prevSibling && stack.empty())
				stack.push_back(instruction);
			else
				ReplaceValueUsersWith(module, instruction, stack.back(), NULL);

			instruction->canBeRemoved = true;
		}

		if(IsMemoryStoreToVariable(instruction, variable))
		{
			if(VmInstruction *inst = getType<VmInstruction>(instruction->arguments[2]))
			{
				hadUpdate = true;

				inst->comment = variable->name->name;

				stack.push_back(getType<VmInstruction>(inst));
			}
			else if(VmConstant *constant = getType<VmConstant>(instruction->arguments[2]))
			{
				hadUpdate = true;

				stack.push_back(constant);
			}
			else
			{
				assert(!"unknown argument type");
			}
		}
		else if(IsPhiOfVariable(instruction, phiNodes))
		{
			stack.push_back(instruction);
		}
	}

	// If we have completed the entry block and there was no definition of the variable, create an argument load or a constant zero for a local
	if(!block->prevSibling && stack.empty())
	{
		module->currentBlock = block;

		while(block->insertPoint && IsBlockTerminator(block->insertPoint->cmd))
			block->insertPoint = block->insertPoint->prevSibling;

		if(IsArgumentVariable(block->parent->function, variable))
		{
			VmValue *loadInst = CreateLoad(ctx, module, NULL, variable->type, CreateVariableAddress(module, NULL, variable, ctx.GetReferenceType(variable->type)), 0);

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}
		else
		{
			VmValue *loadInst = NULL;

			VmType vmType = GetVmType(ctx, variable->type);

			if(vmType == VmType::Int || (NULLC_PTR_SIZE == 4 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantInt(module->allocator, NULL, 0));
			else if(vmType == VmType::Double)
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantDouble(module->allocator, NULL, 0));
			else if(vmType == VmType::Long || (NULLC_PTR_SIZE == 8 && vmType.type == VM_TYPE_POINTER))
				loadInst = CreateLoadImmediate(module, NULL, CreateConstantLong(module->allocator, NULL, 0));
			else
				assert(!"unknown type");

			loadInst->comment = variable->name->name;

			stack.push_back(getType<VmInstruction>(loadInst));
		}

		module->currentBlock = NULL;
	}
	else if(hadUpdate)
	{
		// Finalize last value before terminator instruction
		module->currentBlock = block;
		block->insertPoint = block->lastInstruction->prevSibling;

		if(VmConstant *constant = getType<VmConstant>(stack.back()))
		{
			// Create immediate load for final constant value
			VmValue *loadInst = CreateLoadImmediate(module, constant->source, constant);

			loadInst->comment = variable->name->name;

			stack.back() = loadInst;
		}

		block->insertPoint = block->lastInstruction;
		module->currentBlock = NULL;
	}

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		// Find which predecessor is the X for Y
		unsigned j = ~0u;

		for(unsigned k = 0; k < successor->predecessors.size() && j == ~0u; k++)
		{
			if(block == successor->predecessors[k])
				j = k;
		}

		assert(j != ~0u);

		// Find phi node for current variable
		for(VmInstruction *inst = successor->firstInstruction; inst; inst = inst->nextSibling)
		{
			// We won't find any phi instructions after the last one
			if(inst->cmd != VM_INST_PHI)
				break;

			if(IsPhiOfVariable(inst, phiNodes))
			{
				inst->arguments[j * 2] = stack.back();

				stack.back()->AddUse(inst);
			}
		}
	}

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
		RenameMemoryToRegister(ctx, module, block->dominanceChildren[i], stack, variable, phiNodes);

	stack.shrink(oldSize);
}